

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
helics::FederateInfo::loadInfoFromArgs
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FederateInfo *this,string *args)

{
  ParseOutput PVar1;
  helicsCLI11App *in_RAX;
  InvalidParameter *this_00;
  pointer *__ptr;
  string_view message;
  helicsCLI11App *local_28;
  
  local_28 = in_RAX;
  makeCLIApp((FederateInfo *)&stack0xffffffffffffffd8);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string_const&>(local_28,args);
  if (PVar1 != PARSE_ERROR) {
    config_additional(this,&local_28->super_App);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__return_storage_ptr__,&local_28->remArgs);
    if (local_28 != (helicsCLI11App *)0x0) {
      (*(local_28->super_App)._vptr_App[1])();
    }
    return __return_storage_ptr__;
  }
  this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
  message._M_str = "argument parsing failed";
  message._M_len = 0x17;
  InvalidParameter::InvalidParameter(this_00,message);
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::vector<std::string> FederateInfo::loadInfoFromArgs(const std::string& args)
{
    auto app = makeCLIApp();
    auto ret = app->helics_parse(args);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
    return app->remainArgs();
}